

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O1

unsigned_long PaUtil_EndBufferProcessing(PaUtilBufferProcessor *bp,int *streamCallbackResult)

{
  uint uVar1;
  unsigned_long uVar2;
  long lVar3;
  PaUtilChannelDescriptor *hostInputChannels;
  ulong framesToProcess;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  unsigned_long uVar6;
  bool bVar7;
  unsigned_long noInputInputFrameCount;
  unsigned_long local_38;
  
  uVar1 = bp->inputChannelCount;
  if (bp->useNonAdaptingProcess == 0) {
    if (uVar1 != 0) {
      if (bp->outputChannelCount != 0) {
        uVar4 = AdaptingProcess(bp,streamCallbackResult,
                                (uint)(bp->hostBufferSizeMode !=
                                      paUtilVariableHostBufferSizePartialUsageAllowed));
        return uVar4;
      }
      if (uVar1 != 0) {
        uVar4 = AdaptingInputOnlyProcess
                          (bp,streamCallbackResult,bp->hostInputChannels[0],
                           bp->hostInputFrameCount[0]);
        if (bp->hostInputFrameCount[1] == 0) {
          return uVar4;
        }
        uVar6 = AdaptingInputOnlyProcess
                          (bp,streamCallbackResult,bp->hostInputChannels[1],
                           bp->hostInputFrameCount[1]);
        goto LAB_0010b573;
      }
    }
    uVar4 = AdaptingOutputOnlyProcess
                      (bp,streamCallbackResult,bp->hostOutputChannels[0],bp->hostOutputFrameCount[0]
                      );
    if (bp->hostOutputFrameCount[1] == 0) {
      return uVar4;
    }
    uVar6 = AdaptingOutputOnlyProcess
                      (bp,streamCallbackResult,bp->hostOutputChannels[1],bp->hostOutputFrameCount[1]
                      );
  }
  else {
    if (uVar1 == 0) {
      lVar3 = 0xe8;
    }
    else {
      if (bp->outputChannelCount != 0) {
        uVar4 = bp->hostOutputFrameCount[1] + bp->hostOutputFrameCount[0];
        uVar6 = 0;
        do {
          hostInputChannels = bp->hostInputChannels[0];
          if (hostInputChannels->data == (void *)0x0) {
            local_38 = uVar4;
            puVar5 = &local_38;
            hostInputChannels = (PaUtilChannelDescriptor *)0x0;
          }
          else {
            puVar5 = bp->hostInputFrameCount;
            if (bp->hostInputFrameCount[0] == 0) {
              hostInputChannels = bp->hostInputChannels[1];
              puVar5 = bp->hostInputFrameCount + 1;
            }
          }
          bVar7 = bp->hostOutputFrameCount[0] == 0;
          framesToProcess = bp->hostOutputFrameCount[bVar7];
          if (*puVar5 < bp->hostOutputFrameCount[bVar7]) {
            framesToProcess = *puVar5;
          }
          uVar2 = NonAdaptingProcess(bp,streamCallbackResult,hostInputChannels,
                                     bp->hostOutputChannels[bVar7],framesToProcess);
          *puVar5 = *puVar5 - uVar2;
          bp->hostOutputFrameCount[bVar7] = bp->hostOutputFrameCount[bVar7] - uVar2;
          uVar6 = uVar6 + uVar2;
          uVar4 = uVar4 - uVar2;
        } while (uVar4 != 0);
        return uVar6;
      }
      lVar3 = 0xc0;
    }
    uVar4 = NonAdaptingProcess(bp,streamCallbackResult,bp->hostInputChannels[0],
                               bp->hostOutputChannels[0],
                               *(unsigned_long *)((long)&bp->framesPerUserBuffer + lVar3));
    puVar5 = bp->hostInputFrameCount;
    if (bp->inputChannelCount == 0) {
      puVar5 = bp->hostOutputFrameCount;
    }
    if (puVar5[1] == 0) {
      return uVar4;
    }
    uVar6 = NonAdaptingProcess(bp,streamCallbackResult,bp->hostInputChannels[1],
                               bp->hostOutputChannels[1],puVar5[1]);
  }
LAB_0010b573:
  return uVar4 + uVar6;
}

Assistant:

unsigned long PaUtil_EndBufferProcessing( PaUtilBufferProcessor* bp, int *streamCallbackResult )
{
    unsigned long framesToProcess, framesToGo;
    unsigned long framesProcessed = 0;
    
    if( bp->inputChannelCount != 0 && bp->outputChannelCount != 0
            && bp->hostInputChannels[0][0].data /* input was supplied (see PaUtil_SetNoInput) */
            && bp->hostOutputChannels[0][0].data /* output was supplied (see PaUtil_SetNoOutput) */ )
    {
        assert( (bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1]) ==
                (bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1]) );
    }

    assert( *streamCallbackResult == paContinue
            || *streamCallbackResult == paComplete
            || *streamCallbackResult == paAbort ); /* don't forget to pass in a valid callback result value */

    if( bp->useNonAdaptingProcess )
    {
        if( bp->inputChannelCount != 0 && bp->outputChannelCount != 0 )
        {
            /* full duplex non-adapting process, splice buffers if they are
                different lengths */

            framesToGo = bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1]; /* relies on assert above for input/output equivalence */

            do{
                unsigned long noInputInputFrameCount;
                unsigned long *hostInputFrameCount;
                PaUtilChannelDescriptor *hostInputChannels;
                unsigned long noOutputOutputFrameCount;
                unsigned long *hostOutputFrameCount;
                PaUtilChannelDescriptor *hostOutputChannels;
                unsigned long framesProcessedThisIteration;

                if( !bp->hostInputChannels[0][0].data )
                {
                    /* no input was supplied (see PaUtil_SetNoInput)
                        NonAdaptingProcess knows how to deal with this
                    */
                    noInputInputFrameCount = framesToGo;
                    hostInputFrameCount = &noInputInputFrameCount;
                    hostInputChannels = 0;
                }
                else if( bp->hostInputFrameCount[0] != 0 )
                {
                    hostInputFrameCount = &bp->hostInputFrameCount[0];
                    hostInputChannels = bp->hostInputChannels[0];
                }
                else
                {
                    hostInputFrameCount = &bp->hostInputFrameCount[1];
                    hostInputChannels = bp->hostInputChannels[1];
                }

                if( !bp->hostOutputChannels[0][0].data )
                {
                    /* no output was supplied (see PaUtil_SetNoOutput)
                        NonAdaptingProcess knows how to deal with this
                    */
                    noOutputOutputFrameCount = framesToGo;
                    hostOutputFrameCount = &noOutputOutputFrameCount;
                    hostOutputChannels = 0;
                }
                if( bp->hostOutputFrameCount[0] != 0 )
                {
                    hostOutputFrameCount = &bp->hostOutputFrameCount[0];
                    hostOutputChannels = bp->hostOutputChannels[0];
                }
                else
                {
                    hostOutputFrameCount = &bp->hostOutputFrameCount[1];
                    hostOutputChannels = bp->hostOutputChannels[1];
                }

                framesToProcess = PA_MIN_( *hostInputFrameCount,
                                       *hostOutputFrameCount );

                assert( framesToProcess != 0 );
                
                framesProcessedThisIteration = NonAdaptingProcess( bp, streamCallbackResult,
                        hostInputChannels, hostOutputChannels,
                        framesToProcess );                                       

                *hostInputFrameCount -= framesProcessedThisIteration;
                *hostOutputFrameCount -= framesProcessedThisIteration;

                framesProcessed += framesProcessedThisIteration;
                framesToGo -= framesProcessedThisIteration;
                
            }while( framesToGo > 0 );
        }
        else
        {
            /* half duplex non-adapting process, just process 1st and 2nd buffer */
            /* process first buffer */

            framesToProcess = (bp->inputChannelCount != 0)
                            ? bp->hostInputFrameCount[0]
                            : bp->hostOutputFrameCount[0];

            framesProcessed = NonAdaptingProcess( bp, streamCallbackResult,
                        bp->hostInputChannels[0], bp->hostOutputChannels[0],
                        framesToProcess );

            /* process second buffer if provided */
    
            framesToProcess = (bp->inputChannelCount != 0)
                            ? bp->hostInputFrameCount[1]
                            : bp->hostOutputFrameCount[1];
            if( framesToProcess > 0 )
            {
                framesProcessed += NonAdaptingProcess( bp, streamCallbackResult,
                    bp->hostInputChannels[1], bp->hostOutputChannels[1],
                    framesToProcess );
            }
        }
    }
    else /* block adaption necessary*/
    {

        if( bp->inputChannelCount != 0 && bp->outputChannelCount != 0 )
        {
            /* full duplex */
            
            if( bp->hostBufferSizeMode == paUtilVariableHostBufferSizePartialUsageAllowed  )
            {
                framesProcessed = AdaptingProcess( bp, streamCallbackResult,
                        0 /* dont process partial user buffers */ );
            }
            else
            {
                framesProcessed = AdaptingProcess( bp, streamCallbackResult,
                        1 /* process partial user buffers */ );
            }
        }
        else if( bp->inputChannelCount != 0 )
        {
            /* input only */
            framesToProcess = bp->hostInputFrameCount[0];

            framesProcessed = AdaptingInputOnlyProcess( bp, streamCallbackResult,
                        bp->hostInputChannels[0], framesToProcess );

            framesToProcess = bp->hostInputFrameCount[1];
            if( framesToProcess > 0 )
            {
                framesProcessed += AdaptingInputOnlyProcess( bp, streamCallbackResult,
                        bp->hostInputChannels[1], framesToProcess );
            }
        }
        else
        {
            /* output only */
            framesToProcess = bp->hostOutputFrameCount[0];

            framesProcessed = AdaptingOutputOnlyProcess( bp, streamCallbackResult,
                        bp->hostOutputChannels[0], framesToProcess );

            framesToProcess = bp->hostOutputFrameCount[1];
            if( framesToProcess > 0 )
            {
                framesProcessed += AdaptingOutputOnlyProcess( bp, streamCallbackResult,
                        bp->hostOutputChannels[1], framesToProcess );
            }
        }
    }

    return framesProcessed;
}